

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::parseArray(Parser *this)

{
  int iVar1;
  char *msg;
  int iVar2;
  Parser *in_RDI;
  char *in_stack_00000010;
  Parser *in_stack_00000018;
  int i;
  bool in_stack_ffffffffffffffdf;
  Builder *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  Builder::addArray(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  increaseNesting((Parser *)in_stack_ffffffffffffffe0);
  iVar2 = 0x1455a8;
  iVar1 = skipWhiteSpace(in_stack_00000018,in_stack_00000010);
  if (iVar1 == 0x5d) {
    in_RDI->_pos = in_RDI->_pos + 1;
    decreaseNesting(in_RDI);
    Builder::close(in_RDI->_builderPtr,iVar2);
  }
  else {
    while( true ) {
      Builder::reportAdd((Builder *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      parseJson((Parser *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      iVar2 = 0x1455be;
      iVar1 = skipWhiteSpace(in_stack_00000018,in_stack_00000010);
      if (iVar1 == 0x5d) break;
      if (iVar1 != 0x2c) {
        msg = (char *)__cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                   (ExceptionType)((ulong)in_RDI >> 0x20),msg);
        __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
      }
      in_RDI->_pos = in_RDI->_pos + 1;
      iVar1 = 0x2c;
    }
    in_RDI->_pos = in_RDI->_pos + 1;
    Builder::close(in_RDI->_builderPtr,iVar2);
    decreaseNesting(in_RDI);
  }
  return;
}

Assistant:

void Parser::parseArray() {
  _builderPtr->addArray();

  increaseNesting();

  int i = skipWhiteSpace("Expecting item or ']'");
  if (i == ']') {
    // empty array
    ++_pos;  // the closing ']'
    decreaseNesting();
    _builderPtr->close();
    return;
  }

  while (true) {
    // parse array element itself
    _builderPtr->reportAdd();
    parseJson();
    i = skipWhiteSpace("Expecting ',' or ']'");
    if (i == ']') {
      // end of array
      ++_pos;  // the closing ']'
      _builderPtr->close();
      decreaseNesting();
      return;
    }
    // skip over ','
    if (VELOCYPACK_UNLIKELY(i != ',')) {
      throw Exception(Exception::ParseError, "Expecting ',' or ']'");
    }
    ++_pos;  // the ','
  }

  // should never get here
  VELOCYPACK_ASSERT(false);
}